

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O2

double rapidjson::internal::FastPath(double significand,int exp)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (-0x135 < exp) {
    if (exp < 0) {
      dVar1 = Pow10(-exp);
      dVar1 = significand / dVar1;
    }
    else {
      dVar1 = Pow10(exp);
      dVar1 = dVar1 * significand;
    }
  }
  return dVar1;
}

Assistant:

inline double FastPath(double significand, int exp) {
    if (exp < -308)
        return 0.0;
    else if (exp >= 0)
        return significand * internal::Pow10(exp);
    else
        return significand / internal::Pow10(-exp);
}